

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *potential_parent;
  ImGuiWindow *window;
  bool bVar1;
  
  if ((flags & 4U) != 0) {
    return GImGui->NavWindow != (ImGuiWindow *)0x0;
  }
  potential_parent = GImGui->CurrentWindow;
  if (potential_parent != (ImGuiWindow *)0x0) {
    window = GImGui->NavWindow;
    switch(flags & 3) {
    case 0:
      bVar1 = window == potential_parent;
      break;
    case 1:
      if (window == (ImGuiWindow *)0x0) {
        return false;
      }
      bVar1 = IsWindowChildOf(window,potential_parent);
      return bVar1;
    case 2:
      bVar1 = window == potential_parent->RootWindow;
      break;
    case 3:
      if (window == (ImGuiWindow *)0x0) {
        return false;
      }
      bVar1 = window->RootWindow == potential_parent->RootWindow;
    }
    return bVar1;
  }
  __assert_fail("g.CurrentWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0x18d8,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()
    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}